

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O3

RefAST __thiscall antlr::ASTFactory::dupList(ASTFactory *this,RefAST *t)

{
  ASTFactory *this_00;
  ASTRef *pAVar1;
  ASTRefCount<antlr::AST> *in_RDX;
  AST *pAVar2;
  RefAST nt;
  ASTRefCount<antlr::AST> local_60;
  ASTFactory *local_58;
  ASTRefCount<antlr::AST> local_50 [2];
  ASTRefCount<antlr::AST> local_40;
  ASTRefCount<antlr::AST> local_38;
  
  local_40.ref = in_RDX->ref;
  if (local_40.ref != (ASTRef *)0x0) {
    (local_40.ref)->count = (local_40.ref)->count + 1;
  }
  dupTree(this,t);
  ASTRefCount<antlr::AST>::~ASTRefCount(&local_40);
  local_60.ref = (ASTRef *)this->_vptr_ASTFactory;
  if (local_60.ref != (ASTRef *)0x0) {
    (local_60.ref)->count = (local_60.ref)->count + 1;
  }
  pAVar1 = in_RDX->ref;
  local_58 = this;
  if (pAVar1 != (ASTRef *)0x0) {
    this_00 = (ASTFactory *)(local_50 + 1);
    do {
      if (pAVar1->ptr == (AST *)0x0) break;
      (*pAVar1->ptr->_vptr_AST[0xe])(&local_38);
      ASTRefCount<antlr::AST>::operator=(in_RDX,&local_38);
      ASTRefCount<antlr::AST>::~ASTRefCount(&local_38);
      if (local_60.ref == (ASTRef *)0x0) {
        pAVar2 = (AST *)0x0;
      }
      else {
        pAVar2 = (local_60.ref)->ptr;
      }
      local_50[0].ref = in_RDX->ref;
      if (local_50[0].ref != (ASTRef *)0x0) {
        (local_50[0].ref)->count = (local_50[0].ref)->count + 1;
      }
      dupTree(this_00,t);
      (*pAVar2->_vptr_AST[0x15])(pAVar2,this_00);
      ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)this_00);
      ASTRefCount<antlr::AST>::~ASTRefCount(local_50);
      (*(local_60.ref)->ptr->_vptr_AST[0xe])(&local_38);
      ASTRefCount<antlr::AST>::operator=(&local_60,&local_38);
      ASTRefCount<antlr::AST>::~ASTRefCount(&local_38);
      pAVar1 = in_RDX->ref;
    } while (pAVar1 != (ASTRef *)0x0);
  }
  ASTRefCount<antlr::AST>::~ASTRefCount(&local_60);
  return (RefAST)(ASTRef *)local_58;
}

Assistant:

RefAST ASTFactory::dupList(RefAST t)
{
	RefAST result = dupTree(t);         // if t == null, then result==null
	RefAST nt = result;

	while( t )
	{												// for each sibling of the root
		t = t->getNextSibling();
		nt->setNextSibling(dupTree(t));	// dup each subtree, building new tree
		nt = nt->getNextSibling();
	}
	return result;
}